

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat __thiscall Mat::GaussLin(Mat *this,Mat *rhs,int n)

{
  undefined8 uVar1;
  double dVar2;
  ulong uVar3;
  long lVar4;
  ostream *poVar5;
  uint in_ECX;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  undefined4 in_register_00000014;
  int *piVar10;
  ulong uVar11;
  double *extraout_RDX;
  int i;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int j;
  int iVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  uint uVar20;
  ulong uVar21;
  double *pdVar22;
  long lVar23;
  double *pdVar24;
  double dVar25;
  Mat MVar26;
  long local_a0;
  Mat Aux;
  Mat local_40;
  
  piVar10 = (int *)CONCAT44(in_register_00000014,n);
  Mat(&Aux,rhs);
  if (Aux.n_rows_ == piVar10[1] * *piVar10) {
    uVar6 = in_ECX - 1;
    lVar4 = (long)Aux.n_cols_;
    lVar13 = (long)(int)in_ECX;
    lVar15 = 0;
    uVar14 = 0;
    if (0 < (int)uVar6) {
      uVar14 = (ulong)uVar6;
    }
    iVar8 = 1;
    local_a0 = 0;
    uVar11 = 0;
    pdVar19 = Aux.v_;
    pdVar24 = Aux.v_;
    while( true ) {
      uVar3 = uVar11;
      if ((int)uVar11 < (int)in_ECX) {
        uVar3 = (ulong)in_ECX;
      }
      if (uVar11 == uVar14) break;
      lVar23 = (long)iVar8;
      pdVar18 = (double *)(lVar4 * 8 * lVar23 + (long)pdVar24);
      uVar21 = uVar11 & 0xffffffff;
      lVar12 = lVar23;
      while( true ) {
        uVar20 = (uint)uVar21;
        lVar9 = (long)(int)uVar20;
        if (lVar13 <= lVar12) break;
        uVar7 = (uint)lVar12;
        if (ABS(*pdVar18) <= ABS(Aux.v_[uVar11 + lVar9 * lVar4])) {
          uVar7 = uVar20;
        }
        lVar12 = lVar12 + 1;
        pdVar18 = pdVar18 + lVar4;
        uVar21 = (ulong)uVar7;
      }
      iVar16 = rhs->n_cols_;
      if (uVar11 != uVar21) {
        for (lVar12 = 0; (uVar3 & 0xffffffff) + lVar15 != lVar12; lVar12 = lVar12 + 1) {
          dVar25 = pdVar19[lVar12];
          *(double *)((long)Aux.v_ + lVar12 * 8 + ((long)iVar16 + 1) * local_a0) =
               pdVar24[(int)(uVar20 * iVar16) + lVar12];
          pdVar24[(int)(uVar20 * iVar16) + lVar12] = dVar25;
        }
        lVar12 = *(long *)(piVar10 + 2);
        uVar1 = *(undefined8 *)(lVar12 + uVar11 * 8);
        *(undefined8 *)(lVar12 + uVar11 * 8) = *(undefined8 *)(lVar12 + lVar9 * 8);
        *(undefined8 *)(lVar12 + lVar9 * 8) = uVar1;
        iVar16 = rhs->n_cols_;
      }
      lVar9 = (long)iVar16;
      pdVar18 = (double *)((lVar9 * 8 + 8) * lVar23 + (long)Aux.v_);
      for (lVar12 = lVar23; lVar12 < lVar13; lVar12 = lVar12 + 1) {
        dVar25 = Aux.v_[uVar11 + lVar12 * lVar9];
        dVar2 = Aux.v_[(iVar16 + 1) * (int)uVar11];
        Aux.v_[uVar11 + lVar12 * lVar9] = 0.0;
        pdVar22 = pdVar18;
        for (lVar17 = lVar23; lVar17 < lVar13; lVar17 = lVar17 + 1) {
          *pdVar22 = *(double *)((long)Aux.v_ + lVar17 * 8 + local_a0 * lVar9) * (-dVar25 / dVar2) +
                     *pdVar22;
          pdVar22 = pdVar22 + 1;
        }
        lVar17 = *(long *)(piVar10 + 2);
        *(double *)(lVar17 + lVar12 * 8) =
             (-dVar25 / dVar2) * *(double *)(lVar17 + uVar11 * 8) + *(double *)(lVar17 + lVar12 * 8)
        ;
        pdVar18 = pdVar18 + lVar9;
      }
      iVar8 = iVar8 + 1;
      pdVar24 = pdVar24 + 1;
      local_a0 = local_a0 + 8;
      pdVar19 = pdVar19 + lVar4 + 1;
      lVar15 = lVar15 + -1;
      uVar11 = uVar11 + 1;
    }
    Mat(this,in_ECX);
    lVar4 = *(long *)(piVar10 + 2);
    iVar8 = rhs->n_cols_;
    pdVar24 = this->v_;
    pdVar24[(int)uVar6] =
         *(double *)(lVar4 + (long)(int)uVar6 * 8) /
         Aux.v_[(long)(int)(uVar6 * iVar8 + in_ECX) + -1];
    lVar15 = (long)(int)(in_ECX - 2);
    pdVar18 = (double *)(((long)iVar8 * 8 + 8) * lVar15 + (long)Aux.v_);
    pdVar19 = pdVar24 + lVar15;
    for (; -1 < lVar15; lVar15 = lVar15 + -1) {
      dVar25 = 0.0;
      for (lVar12 = 1; lVar15 + lVar12 < lVar13; lVar12 = lVar12 + 1) {
        dVar25 = dVar25 - pdVar18[lVar12] * pdVar19[lVar12];
      }
      pdVar24[lVar15] =
           (dVar25 + *(double *)(lVar4 + lVar15 * 8)) / Aux.v_[(iVar8 + 1) * (int)lVar15];
      pdVar18 = (double *)((long)pdVar18 + ((long)iVar8 << 3 ^ 0xfffffffffffffff8U));
      pdVar19 = pdVar19 + -1;
    }
    operator~(&local_40);
    ~Mat(&local_40);
    ~Mat(&Aux);
    MVar26.v_ = extraout_RDX;
    MVar26._0_8_ = this;
    return MVar26;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: Invalid dimension in gaussLin");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

Mat Mat::GaussLin(const Mat rhs,int n) const
{
	Mat Aux = (*this);
	if ( (Aux.n_rows_!=rhs.Size() )) {
    cerr << "ERROR: Invalid dimension in gaussLin" << endl;
    exit(1);
	};
	double m;
	for (int k=0; k<n-1; k++ )
	{
		int l=k;
		// Rearrangement
		for (int i=k+1; i<n; i++)
		{
			if (abs(Aux(i,k)) > abs(Aux(l,k))) 
				l=i;
		}
		if (l!=k)
		{
			for (int j = k; j < n; j++)
			{
				m = Aux(k,j);
				Aux.v_[k*n_cols_+j] = Aux.v_[l*n_cols_+j];
				Aux.v_[l*n_cols_+j] = m;
			}
			m = rhs.v_[k];
			rhs.v_[k] = rhs.v_[l];
		    rhs.v_[l] = m;
		}
		for (int i = k+1; i < n; i++)
		{
			m = Aux.v_[i*n_cols_+k] / Aux.v_[k*n_cols_+k];
			Aux.v_[i*n_cols_+k] = 0.0;
			for ( int j = k+1; j < n; j++)
			{
				Aux.v_[i*n_cols_ + j] = Aux.v_[i*n_cols_ + j] - m * Aux.v_[k*n_cols_+j];
			}
			rhs.v_[i] = rhs.v_[i] - m * rhs.v_[k] ; 
		}
	}
	Mat X(n);
	X.v_[n-1] = rhs.v_[n-1] / Aux.v_[(n-1)*n_cols_+n-1];
	for (int i = n-2 ;i >-1 ;i--)
	{
		double s = 0.0;		
		for (int j = i+1 ; j < n; j++)
			s = s - Aux.v_[i*n_cols_ + j] * X.v_[j];
		X.v_[i] = (rhs.v_[i] + s)/ Aux.v_[i*n_cols_ + i];
	}
	~Aux;
	return X;
}